

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

QString * __thiscall
QtMWidgets::PickerPrivate::itemText
          (QString *__return_storage_ptr__,PickerPrivate *this,QModelIndex *index)

{
  QVariant local_30;
  
  if (((index->r < 0) || (index->c < 0)) || (index->m == (QAbstractItemModel *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (**(code **)(*(long *)this->model + 0x90))(&local_30,this->model,index,0);
    QVariant::toString();
    QVariant::~QVariant(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

QString
PickerPrivate::itemText( const QModelIndex & index ) const
{
	return index.isValid() ? model->data( index, Qt::DisplayRole ).toString() :
		QString();
}